

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  size_t sVar1;
  long lVar2;
  uint nbBits;
  uint uVar3;
  uint uVar4;
  BIT_DStream_status BVar5;
  BIT_DStream_status BVar6;
  BIT_DStream_status BVar7;
  BIT_DStream_status BVar8;
  undefined1 *puVar9;
  size_t sVar10;
  ulong uVar11;
  ulong srcSize;
  ulong srcSize_00;
  undefined1 *puVar12;
  undefined1 *puVar13;
  uint uVar14;
  ulong srcSize_01;
  void *pvVar15;
  undefined1 *puVar16;
  uint uVar17;
  bool bVar18;
  BIT_DStream_t BStack_100;
  BIT_DStream_t BStack_d8;
  BIT_DStream_t BStack_b0;
  undefined1 *puStack_88;
  undefined1 *puStack_80;
  BIT_DStream_t BStack_78;
  size_t sStack_50;
  undefined1 *puStack_48;
  undefined1 *puStack_40;
  undefined1 *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar10 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar10;
  }
  if (bmi2 == 0) {
    if (cSrcSize < 10) {
      sVar10 = 0xffffffffffffffec;
    }
    else {
      srcSize_01 = (ulong)*cSrc;
      srcSize_00 = (ulong)*(ushort *)((long)cSrc + 2);
      srcSize = (ulong)*(ushort *)((long)cSrc + 4);
      uVar11 = srcSize + srcSize_00 + srcSize_01 + 6;
      sVar10 = 0xffffffffffffffec;
      if (uVar11 <= cSrcSize) {
        nbBits = (uint)*(byte *)((long)DTable + 2);
        sStack_50 = maxDstSize;
        sVar10 = BIT_initDStream(&BStack_b0,(void *)((long)cSrc + 6),srcSize_01);
        if (sVar10 < 0xffffffffffffff89) {
          pvVar15 = (void *)((long)cSrc + srcSize_01 + 6);
          sVar10 = BIT_initDStream(&BStack_d8,pvVar15,srcSize_00);
          if (sVar10 < 0xffffffffffffff89) {
            pvVar15 = (void *)((long)pvVar15 + srcSize_00);
            sVar10 = BIT_initDStream(&BStack_100,pvVar15,srcSize);
            if ((sVar10 < 0xffffffffffffff89) &&
               (sVar10 = BIT_initDStream(&BStack_78,(void *)((long)pvVar15 + srcSize),
                                         cSrcSize - uVar11), sVar10 < 0xffffffffffffff89)) {
              puStack_38 = (undefined1 *)((long)dst + sStack_50);
              puStack_40 = (undefined1 *)((long)dst + (sStack_50 - 3));
              uVar11 = sStack_50 + 3 >> 2;
              puStack_48 = (undefined1 *)((long)dst + uVar11);
              puStack_88 = puStack_48 + uVar11;
              puStack_80 = puStack_88 + uVar11;
              lVar2 = uVar11 * 3;
              bVar18 = true;
              for (; (puVar16 = (undefined1 *)((long)dst + lVar2), bVar18 && (puVar16 < puStack_40))
                  ; dst = (void *)((long)dst + 4)) {
                sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                uVar3 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_b0.bitsConsumed;
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_b0.bitsConsumed = uVar3;
                sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                uVar14 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_d8.bitsConsumed;
                *(undefined1 *)((long)dst + uVar11) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4)
                ;
                BStack_d8.bitsConsumed = uVar14;
                sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                uVar17 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_100.bitsConsumed;
                *(undefined1 *)((long)dst + uVar11 * 2) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_100.bitsConsumed = uVar17;
                sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                uVar4 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_78.bitsConsumed;
                *(undefined1 *)((long)dst + lVar2) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_78.bitsConsumed = uVar4;
                sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                uVar3 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar3;
                *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_b0.bitsConsumed = uVar3;
                sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                uVar14 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar14;
                *(undefined1 *)((long)dst + uVar11 + 1) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_d8.bitsConsumed = uVar14;
                sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                uVar17 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar17;
                *(undefined1 *)((long)dst + uVar11 * 2 + 1) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_100.bitsConsumed = uVar17;
                sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                uVar4 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar4;
                *(undefined1 *)((long)dst + lVar2 + 1) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_78.bitsConsumed = uVar4;
                sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                uVar3 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar3;
                *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_b0.bitsConsumed = uVar3;
                sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                uVar14 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar14;
                *(undefined1 *)((long)dst + uVar11 + 2) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_d8.bitsConsumed = uVar14;
                sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                uVar17 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar17;
                *(undefined1 *)((long)dst + uVar11 * 2 + 2) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_100.bitsConsumed = uVar17;
                sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                uVar4 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar4;
                *(undefined1 *)((long)dst + lVar2 + 2) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BStack_78.bitsConsumed = uVar4;
                sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                BStack_b0.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar3;
                *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                BStack_d8.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar14;
                *(undefined1 *)((long)dst + uVar11 + 3) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                BStack_100.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar17;
                *(undefined1 *)((long)dst + uVar11 * 2 + 3) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                BStack_78.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar4;
                *(undefined1 *)((long)dst + lVar2 + 3) =
                     *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                BVar5 = BIT_reloadDStreamFast(&BStack_b0);
                BVar6 = BIT_reloadDStreamFast(&BStack_d8);
                BVar7 = BIT_reloadDStreamFast(&BStack_100);
                BVar8 = BIT_reloadDStreamFast(&BStack_78);
                bVar18 = BVar8 == BIT_DStream_unfinished &&
                         (BVar7 == BIT_DStream_unfinished &&
                         (BVar6 == BIT_DStream_unfinished && BVar5 == BIT_DStream_unfinished));
              }
              puVar12 = (undefined1 *)((long)dst + uVar11);
              puVar13 = (undefined1 *)((long)dst + uVar11 * 2);
              sVar10 = 0xffffffffffffffec;
              if (puVar13 <= puStack_80 && (puVar12 <= puStack_88 && dst <= puStack_48)) {
                puVar9 = puStack_48 + -3;
                while ((BVar5 = BIT_reloadDStream(&BStack_b0), dst < puVar9 &&
                       (BVar5 == BIT_DStream_unfinished))) {
                  sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                  uVar4 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_b0.bitsConsumed;
                  *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_b0.bitsConsumed = uVar4;
                  sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                  uVar4 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar4;
                  *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_b0.bitsConsumed = uVar4;
                  sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                  uVar4 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar4;
                  *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_b0.bitsConsumed = uVar4;
                  sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                  BStack_b0.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar4;
                  *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  dst = (void *)((long)dst + 4);
                }
                for (; uVar4 = BStack_b0.bitsConsumed, dst < puStack_48;
                    dst = (void *)((long)dst + 1)) {
                  sVar10 = BIT_lookBitsFast(&BStack_b0,nbBits);
                  BStack_b0.bitsConsumed = uVar4 + *(byte *)((long)DTable + sVar10 * 2 + 5);
                  *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                }
                puVar9 = puStack_88 + -3;
                while ((BVar5 = BIT_reloadDStream(&BStack_d8), puVar12 < puVar9 &&
                       (BVar5 == BIT_DStream_unfinished))) {
                  sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                  uVar3 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_d8.bitsConsumed;
                  *puVar12 = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_d8.bitsConsumed = uVar3;
                  sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                  uVar3 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar3;
                  puVar12[1] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_d8.bitsConsumed = uVar3;
                  sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                  uVar3 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar3;
                  puVar12[2] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_d8.bitsConsumed = uVar3;
                  sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                  BStack_d8.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar3;
                  puVar12[3] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  puVar12 = puVar12 + 4;
                }
                for (; uVar3 = BStack_d8.bitsConsumed, puVar12 < puStack_88; puVar12 = puVar12 + 1)
                {
                  sVar10 = BIT_lookBitsFast(&BStack_d8,nbBits);
                  BStack_d8.bitsConsumed = uVar3 + *(byte *)((long)DTable + sVar10 * 2 + 5);
                  *puVar12 = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                }
                puVar12 = puStack_80 + -3;
                while ((BVar5 = BIT_reloadDStream(&BStack_100), puVar13 < puVar12 &&
                       (BVar5 == BIT_DStream_unfinished))) {
                  sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                  uVar14 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_100.bitsConsumed;
                  *puVar13 = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_100.bitsConsumed = uVar14;
                  sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                  uVar14 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar14;
                  puVar13[1] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_100.bitsConsumed = uVar14;
                  sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                  uVar14 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar14;
                  puVar13[2] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_100.bitsConsumed = uVar14;
                  sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                  BStack_100.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar14;
                  puVar13[3] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  puVar13 = puVar13 + 4;
                }
                for (; uVar14 = BStack_100.bitsConsumed, puVar13 < puStack_80; puVar13 = puVar13 + 1
                    ) {
                  sVar10 = BIT_lookBitsFast(&BStack_100,nbBits);
                  BStack_100.bitsConsumed = uVar14 + *(byte *)((long)DTable + sVar10 * 2 + 5);
                  *puVar13 = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                }
                while ((BVar5 = BIT_reloadDStream(&BStack_78), puVar16 < puStack_40 &&
                       (BVar5 == BIT_DStream_unfinished))) {
                  sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                  uVar17 = *(byte *)((long)DTable + sVar10 * 2 + 5) + BStack_78.bitsConsumed;
                  *puVar16 = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_78.bitsConsumed = uVar17;
                  sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                  uVar17 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar17;
                  puVar16[1] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_78.bitsConsumed = uVar17;
                  sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                  uVar17 = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar17;
                  puVar16[2] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  BStack_78.bitsConsumed = uVar17;
                  sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                  BStack_78.bitsConsumed = *(byte *)((long)DTable + sVar10 * 2 + 5) + uVar17;
                  puVar16[3] = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                  puVar16 = puVar16 + 4;
                }
                for (; uVar17 = BStack_78.bitsConsumed, puVar16 < puStack_38; puVar16 = puVar16 + 1)
                {
                  sVar10 = BIT_lookBitsFast(&BStack_78,nbBits);
                  BStack_78.bitsConsumed = uVar17 + *(byte *)((long)DTable + sVar10 * 2 + 5);
                  *puVar16 = *(undefined1 *)((long)DTable + sVar10 * 2 + 4);
                }
                sVar1 = 0xffffffffffffffec;
                if (BStack_78.bitsConsumed != 0x40) {
                  sStack_50 = sVar1;
                }
                if (BStack_78.ptr != BStack_78.start) {
                  sStack_50 = sVar1;
                }
                if (uVar14 != 0x40) {
                  sStack_50 = sVar1;
                }
                if (BStack_100.ptr != BStack_100.start) {
                  sStack_50 = sVar1;
                }
                if (uVar3 != 0x40) {
                  sStack_50 = sVar1;
                }
                if (BStack_d8.ptr != BStack_d8.start) {
                  sStack_50 = sVar1;
                }
                if (uVar4 != 0x40) {
                  sStack_50 = sVar1;
                }
                sVar10 = sStack_50;
                if (BStack_b0.ptr != BStack_b0.start) {
                  sVar10 = sVar1;
                }
              }
            }
          }
        }
      }
    }
    return sVar10;
  }
  sVar10 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
  return sVar10;
}

Assistant:

size_t HUF_decompress4X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}